

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O3

void __thiscall QTextBrowser::clearHistory(QTextBrowser *this)

{
  QList<QTextBrowserPrivate::HistoryEntry> *this_00;
  long lVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  HistoryEntry historyEntry;
  undefined1 local_69;
  undefined1 local_68 [40];
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.
                    field_0x8;
  QList<QTextBrowserPrivate::HistoryEntry>::clear
            ((QList<QTextBrowserPrivate::HistoryEntry> *)(lVar1 + 0x3e0));
  if (*(long *)(lVar1 + 0x3d8) != 0) {
    this_00 = (QList<QTextBrowserPrivate::HistoryEntry> *)(lVar1 + 0x3c8);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = QList<QTextBrowserPrivate::HistoryEntry>::end(this_00);
    QUrl::QUrl((QUrl *)local_68,&iVar2.i[-1].url);
    local_68._8_8_ = iVar2.i[-1].title.d.d;
    local_68._16_8_ = iVar2.i[-1].title.d.ptr;
    local_68._24_8_ = iVar2.i[-1].title.d.size;
    if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_68._8_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_68._8_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_38 = (undefined1 *)CONCAT44(local_38._4_4_,iVar2.i[-1].type);
    local_68._32_4_ = iVar2.i[-1].hpos;
    local_68._36_4_ = iVar2.i[-1].vpos;
    puStack_40._0_4_ = iVar2.i[-1].focusIndicatorPosition;
    puStack_40._4_4_ = iVar2.i[-1].focusIndicatorAnchor;
    QList<QTextBrowserPrivate::HistoryEntry>::clear(this_00);
    QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::
    emplace<QTextBrowserPrivate::HistoryEntry_const&>
              ((QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *)this_00,
               *(qsizetype *)(lVar1 + 0x3d8),(HistoryEntry *)local_68);
    QList<QTextBrowserPrivate::HistoryEntry>::end(this_00);
    QUrl::operator=((QUrl *)(lVar1 + 0x3f8),(QUrl *)local_68);
    if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._8_8_,2,0x10);
      }
    }
    QUrl::~QUrl((QUrl *)local_68);
  }
  local_69 = 0;
  local_68._0_8_ = (QUrlPrivate *)0x0;
  local_68._8_8_ = (Data *)&local_69;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)local_68);
  local_69 = 0;
  local_68._0_8_ = (QUrlPrivate *)0x0;
  local_68._8_8_ = (Data *)&local_69;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)local_68);
  QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::clearHistory()
{
    Q_D(QTextBrowser);
    d->forwardStack.clear();
    if (!d->stack.isEmpty()) {
        QTextBrowserPrivate::HistoryEntry historyEntry = d->stack.top();
        d->stack.clear();
        d->stack.push(historyEntry);
        d->home = historyEntry.url;
    }
    emit forwardAvailable(false);
    emit backwardAvailable(false);
    emit historyChanged();
}